

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O0

void Search::search_timer(position *p,limits *lims)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  bool local_3f;
  anon_class_4_1_a7caa8a3 local_3c;
  double dStack_38;
  anon_class_4_1_a7caa8a3 sleep;
  double time_limit;
  int delay;
  bool fixed_time;
  clock c;
  limits *lims_local;
  position *p_local;
  
  c._end.__d.__r = (duration)(duration)lims;
  util::clock::clock((clock *)&delay);
  util::clock::start((clock *)&delay);
  iVar1 = *(int *)((long)c._end.__d.__r + 0x18);
  dStack_38 = estimate_max_time(p,(limits *)c._end.__d.__r);
  local_3c.delay = 1;
  if (iVar1 == 0) {
    if (dStack_38 <= -1.0) {
      do {
        dVar4 = util::clock::elapsed_ms((clock *)&delay);
        elapsed = elapsed + dVar4;
        search_timer::anon_class_4_1_a7caa8a3::operator()(&local_3c);
        local_3f = false;
        if ((UCI_SIGNALS.stop & 1U) == 0) {
          local_3f = std::atomic::operator_cast_to_bool((atomic *)&searching);
        }
      } while (local_3f != false);
    }
    else {
      do {
        dVar4 = util::clock::elapsed_ms((clock *)&delay);
        elapsed = elapsed + dVar4;
        search_timer::anon_class_4_1_a7caa8a3::operator()(&local_3c);
        bVar2 = false;
        if ((UCI_SIGNALS.stop & 1U) == 0) {
          bVar3 = std::atomic::operator_cast_to_bool((atomic *)&searching);
          bVar2 = false;
          if (bVar3) {
            bVar2 = elapsed <= dStack_38;
          }
        }
      } while (bVar2);
    }
  }
  else {
    do {
      dVar4 = util::clock::elapsed_ms((clock *)&delay);
      elapsed = elapsed + dVar4;
      search_timer::anon_class_4_1_a7caa8a3::operator()(&local_3c);
      bVar2 = false;
      if ((UCI_SIGNALS.stop & 1U) == 0) {
        bVar3 = std::atomic::operator_cast_to_bool((atomic *)&searching);
        bVar2 = false;
        if (bVar3) {
          bVar2 = elapsed <= (double)*(uint *)((long)c._end.__d.__r + 0x18);
        }
      }
    } while (bVar2);
  }
  UCI_SIGNALS.stop = true;
  return;
}

Assistant:

void Search::search_timer(position& p, limits& lims) {
	util::clock c;
	c.start();
	bool fixed_time = lims.movetime > 0;
	int delay = 1; // ms
	double time_limit = estimate_max_time(p, lims);
	auto sleep = [delay]() { std::this_thread::sleep_for(std::chrono::milliseconds(delay)); };

	if (fixed_time) {
		do {
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching && elapsed <= lims.movetime);
	}
	else if (time_limit > -1) {
		// dynamic time estimate in a real game
		do {
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching && elapsed <= time_limit);
	}
	else {
		do {
			// analysis mode (infinite time)
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching);
	}
	UCI_SIGNALS.stop = true;
	return;
}